

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O2

Handshake * __thiscall
webfront::msg::MessageBase<webfront::msg::Handshake>::castFromRawData
          (MessageBase<webfront::msg::Handshake> *this,
          span<const_std::byte,_18446744073709551615UL> data)

{
  runtime_error *this_00;
  
  if ((pointer)0x1 < data._M_ptr) {
    return (Handshake *)this;
  }
  this_00 = (runtime_error *)
            __cxa_allocate_exception
                      (0x10,data._M_ptr,data._M_extent._M_extent_value._M_extent_value);
  std::runtime_error::runtime_error(this_00,"Not enough data to form a message Header");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static const T* castFromRawData(std::span<const std::byte> data) {
        if (data.size() < sizeof(typename T::Header)) throw std::runtime_error("Not enough data to form a message Header");
        auto message = reinterpret_cast<const T*>(data.data());
        if ((data.size() + message->getPayloadSize()) < sizeof(typename T::Header))
            throw std::runtime_error("Not enough data to form a complete message");
        return message;
    }